

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ogf_v3.cxx
# Opt level: O0

void __thiscall
xray_re::xr_ogf_v3::partition_io::import
          (partition_io *this,xr_reader *r,xr_bone_vec *all_bones,int version)

{
  __type _Var1;
  uint16_t uVar2;
  uint32_t uVar3;
  reference ppxVar4;
  string *psVar5;
  undefined1 local_50 [8];
  string name;
  uint_fast32_t n;
  int version_local;
  xr_bone_vec *all_bones_local;
  xr_reader *r_local;
  partition_io *this_local;
  
  xr_reader::r_sz(r,&(this->super_xr_partition).m_name);
  uVar2 = xr_reader::r_u16(r);
  name.field_2._8_8_ = ZEXT28(uVar2);
  do {
    if (name.field_2._8_8_ == 0) {
      return;
    }
    std::__cxx11::string::string((string *)local_50);
    if (version == 1) {
      uVar3 = xr_reader::r_u32(r);
      ppxVar4 = std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::at
                          (all_bones,(ulong)uVar3);
      psVar5 = xr_bone::name_abi_cxx11_(*ppxVar4);
      std::__cxx11::string::operator=((string *)local_50,(string *)psVar5);
    }
    else if (version == 2) {
      xr_reader::r_sz(r,(string *)local_50);
    }
    else if (version == 3) {
      xr_reader::r_sz(r,(string *)local_50);
      uVar3 = xr_reader::r_u32(r);
      ppxVar4 = std::vector<xray_re::xr_bone_*,_std::allocator<xray_re::xr_bone_*>_>::at
                          (all_bones,(ulong)uVar3);
      psVar5 = xr_bone::name_abi_cxx11_(*ppxVar4);
      _Var1 = std::operator==(psVar5,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_50);
      if (!_Var1) {
        __assert_fail("all_bones.at(r.r_u32())->name() == name",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_ogf_v3.cxx"
                      ,0x150,
                      "void xray_re::xr_ogf_v3::partition_io::import(xr_reader &, xr_bone_vec &, int)"
                     );
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&(this->super_xr_partition).m_bones,(value_type *)local_50);
    std::__cxx11::string::~string((string *)local_50);
    name.field_2._8_8_ = name.field_2._8_8_ + -1;
  } while( true );
}

Assistant:

inline void xr_ogf_v3::partition_io::import(xr_reader& r, xr_bone_vec& all_bones, int version)
{
	r.r_sz(m_name);
	for (uint_fast32_t n = r.r_u16(); n; --n)
	{
		std::string name;
		switch (version)
		{
		case 1:
			name =  all_bones.at(r.r_u32())->name();
			break;
		case 2:
			r.r_sz(name);
			break;
		case 3:
			r.r_sz(name);
			xr_assert(all_bones.at(r.r_u32())->name() == name);
		}
		m_bones.push_back(name);
	}
}